

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNDescr.cpp
# Opt level: O0

void __thiscall NaNeuralNetDescr::MakeDefaultDelays(NaNeuralNetDescr *this)

{
  NaReal *pNVar1;
  long in_RDI;
  double dVar2;
  NaVector *unaff_retaddr;
  uint i;
  undefined8 in_stack_ffffffffffffffd8;
  NaVector *in_stack_ffffffffffffffe0;
  undefined4 local_c;
  long lVar3;
  
  lVar3 = in_RDI;
  NaVector::new_dim(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20));
  NaVector::new_dim(unaff_retaddr,(uint)((ulong)lVar3 >> 0x20));
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0x58); local_c = local_c + 1) {
    in_stack_ffffffffffffffe0 = (NaVector *)(double)local_c;
    pNVar1 = NaVector::operator[]
                       (in_stack_ffffffffffffffe0,(uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    *pNVar1 = (NaReal)in_stack_ffffffffffffffe0;
  }
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0x5c); local_c = local_c + 1) {
    dVar2 = (double)local_c;
    pNVar1 = NaVector::operator[](in_stack_ffffffffffffffe0,(uint)((ulong)dVar2 >> 0x20));
    *pNVar1 = dVar2;
  }
  return;
}

Assistant:

void
NaNeuralNetDescr::MakeDefaultDelays ()
{
    vInputDelays.new_dim(nInputsRepeat);
    vOutputDelays.new_dim(nOutputsRepeat);

    /* default delays */
    unsigned	i;
    for(i = 0; i < nInputsRepeat; ++i)
      vInputDelays[i] = i;
    for(i = 0; i < nOutputsRepeat; ++i)
      vOutputDelays[i] = i;
}